

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O2

void __thiscall nite::PoliVec2::set(PoliVec2 *this,string *w,string *h)

{
  double dVar1;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  string wi;
  string hi;
  
  this->useAbs = false;
  std::__cxx11::string::string((string *)&local_a8,(string *)w);
  strRemoveSpaces((string *)local_68,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_88,(string *)h);
  strRemoveSpaces((string *)((long)&wi.field_2 + 8),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (((pointer)((long)local_68 + -1))[(long)wi._M_dataplus._M_p] == '%') {
    std::__cxx11::string::erase((ulong)local_68,(ulong)(wi._M_dataplus._M_p + -1));
  }
  if (hi._M_dataplus._M_p[wi.field_2._8_8_ + -1] == '%') {
    std::__cxx11::string::erase((ulong)((long)&wi.field_2 + 8),(ulong)(hi._M_dataplus._M_p + -1));
  }
  dVar1 = toFloat((string *)local_68);
  (this->rel).x = (float)(dVar1 / 100.0);
  dVar1 = toFloat((string *)((long)&wi.field_2 + 8));
  (this->rel).y = (float)(dVar1 / 100.0);
  std::__cxx11::string::~string((string *)(wi.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void nite::PoliVec2::set(const String &w, const String &h){
    this->useAbs = false;
    String wi = nite::strRemoveSpaces(w);
    String hi = nite::strRemoveSpaces(h);
    if(wi[wi.length()-1] == '%'){
        wi.erase(wi.length()-1);
    }
    if(hi[hi.length()-1] == '%'){
        hi.erase(hi.length()-1);
    }    
    this->rel.x = nite::toFloat(wi) / 100.0f;
    this->rel.y = nite::toFloat(hi) / 100.0f;
}